

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::Data
          (Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *this,
          Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *other,size_t reserved)

{
  long lVar1;
  undefined4 uVar2;
  bool bVar3;
  size_t sVar4;
  int *piVar5;
  Node<int,_QSocketNotifierSetUNIX> *pNVar6;
  Node<int,_QSocketNotifierSetUNIX> *pNVar7;
  long in_RSI;
  Span<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *in_RDI;
  long in_FS_OFFSET;
  R_conflict7 RVar8;
  size_t otherNSpans;
  Node<int,_QSocketNotifierSetUNIX> *newNode;
  Node<int,_QSocketNotifierSetUNIX> *n;
  size_t index;
  Span *span;
  size_t s;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff70;
  Span<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *this_00;
  int *key;
  size_t in_stack_ffffffffffffffb0;
  ulong i;
  int *local_40;
  unsigned_long local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20));
  *(undefined8 *)(in_RDI->offsets + 8) = *(undefined8 *)(in_RSI + 8);
  in_RDI->offsets[0x10] = '\0';
  in_RDI->offsets[0x11] = '\0';
  in_RDI->offsets[0x12] = '\0';
  in_RDI->offsets[0x13] = '\0';
  in_RDI->offsets[0x14] = '\0';
  in_RDI->offsets[0x15] = '\0';
  in_RDI->offsets[0x16] = '\0';
  in_RDI->offsets[0x17] = '\0';
  *(undefined8 *)(in_RDI->offsets + 0x18) = *(undefined8 *)(in_RSI + 0x18);
  in_RDI->offsets[0x20] = '\0';
  in_RDI->offsets[0x21] = '\0';
  in_RDI->offsets[0x22] = '\0';
  in_RDI->offsets[0x23] = '\0';
  in_RDI->offsets[0x24] = '\0';
  in_RDI->offsets[0x25] = '\0';
  in_RDI->offsets[0x26] = '\0';
  in_RDI->offsets[0x27] = '\0';
  qMax<unsigned_long>((unsigned_long *)(in_RDI->offsets + 8),&local_20);
  sVar4 = GrowthPolicy::bucketsForCapacity((size_t)in_RDI);
  *(size_t *)(in_RDI->offsets + 0x10) = sVar4;
  RVar8 = allocateSpans(in_stack_ffffffffffffffb0);
  *(Span **)(in_RDI->offsets + 0x20) = RVar8.spans;
  piVar5 = (int *)(*(ulong *)(in_RSI + 0x10) >> 7);
  this_00 = in_RDI;
  key = piVar5;
  for (local_40 = (int *)0x0; local_40 < piVar5; local_40 = (int *)((long)local_40 + 1)) {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (i = 0; i < 0x80; i = i + 1) {
      bVar3 = Span<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::hasNode
                        ((Span<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *)
                         (lVar1 + (long)local_40 * 0x90),i);
      if (bVar3) {
        pNVar6 = Span<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::at(this_00,(size_t)in_RDI);
        local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_18 = findBucket<int>((Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *)
                                   RVar8.spans,key);
        pNVar7 = Bucket::insert((Bucket *)0x6bfdf7);
        uVar2 = *(undefined4 *)&pNVar6->field_0x4;
        pNVar7->key = pNVar6->key;
        *(undefined4 *)&pNVar7->field_0x4 = uVar2;
        (pNVar7->value).notifiers[0] = (pNVar6->value).notifiers[0];
        (pNVar7->value).notifiers[1] = (pNVar6->value).notifiers[1];
        (pNVar7->value).notifiers[2] = (pNVar6->value).notifiers[2];
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }